

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::InternalMetadata
          (InternalMetadata *this,Arena *arena,bool is_message_owned)

{
  Arena *pAVar1;
  LogMessage *other;
  undefined7 in_register_00000011;
  LogFinisher local_49;
  LogMessage local_48;
  
  pAVar1 = (Arena *)((ulong)arena | 2);
  if ((int)CONCAT71(in_register_00000011,is_message_owned) == 0) {
    pAVar1 = arena;
  }
  this->ptr_ = (intptr_t)pAVar1;
  if (arena == (Arena *)0x0 && is_message_owned) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/metadata_lite.h"
               ,0x45);
    other = LogMessage::operator<<
                      (&local_48,"CHECK failed: !is_message_owned || arena != nullptr: ");
    LogFinisher::operator=(&local_49,other);
    LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

explicit InternalMetadata(Arena* arena, bool is_message_owned = false)
      : ptr_(is_message_owned
                 ? reinterpret_cast<intptr_t>(arena) | kMessageOwnedArenaTagMask
                 : reinterpret_cast<intptr_t>(arena)) {
    GOOGLE_DCHECK(!is_message_owned || arena != nullptr);
  }